

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O1

void __thiscall
mocker::detail::RegisterAllocator::color(RegisterAllocator *this,RegMap<Node> *coloring)

{
  Line *__args;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **__n;
  Section *pSVar2;
  const_iterator __position;
  bool bVar3;
  bool bVar4;
  int iVar5;
  _Node *p_Var6;
  _List_node_base *p_Var7;
  iterator __position_00;
  _List_node_base *p_Var8;
  shared_ptr<mocker::nasm::Register> src;
  list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> insts;
  shared_ptr<mocker::nasm::Mov> p;
  shared_ptr<mocker::nasm::Register> dest;
  shared_ptr<mocker::nasm::Inst> newInst;
  shared_ptr<mocker::nasm::Addr> local_d0;
  _List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_> local_c0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  Line LStack_98;
  RegMap<std::shared_ptr<Register>_> *local_68;
  shared_ptr<mocker::nasm::Addr> local_60;
  long local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  shared_ptr<mocker::nasm::Inst> local_40;
  
  local_c0._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c0;
  local_c0._M_impl._M_node._M_size = 0;
  p_Var7 = (this->funcBeg)._M_node;
  p_Var8 = (this->funcEnd)._M_node;
  local_c0._M_impl._M_node.super__List_node_base._M_prev =
       local_c0._M_impl._M_node.super__List_node_base._M_next;
  local_68 = coloring;
  if (p_Var8 != p_Var7) {
    do {
      __args = (Line *)(p_Var7 + 1);
      if (p_Var7[3]._M_next == (_List_node_base *)0x0) {
        p_Var6 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                 _M_create_node<mocker::nasm::Line_const&>
                           ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)&local_c0
                            ,__args);
        std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
        local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
      }
      else {
        nasm::replaceRegs((nasm *)&local_40,(shared_ptr<mocker::nasm::Inst> *)(p_Var7 + 3),local_68)
        ;
        nasm::dyc<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Inst>&>
                  ((nasm *)&local_a8,&local_40);
        if (local_a8 == 0) {
LAB_0013400c:
          bVar4 = false;
        }
        else {
          local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(local_a8 + 8);
          local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_a8 + 0x10);
          if (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                    ((nasm *)&local_50,&local_d0);
          if (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(element_type **)(local_a8 + 0x18);
          local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_a8 + 0x20);
          if (local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          nasm::dyc<mocker::nasm::Register,std::shared_ptr<mocker::nasm::Addr>const>
                    ((nasm *)&local_d0,&local_60);
          if (local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          bVar4 = false;
          bVar3 = true;
          if (((local_50 != 0) &&
              (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
               (element_type *)0x0)) &&
             (__n = *(_func_int ***)(local_50 + 0x10),
             __n == local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr[2]._vptr_Addr)) {
            if (__n != (_func_int **)0x0) {
              iVar5 = bcmp(*(void **)(local_50 + 8),
                           local_d0.
                           super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                           [1]._vptr_Addr,(size_t)__n);
              bVar4 = false;
              if (iVar5 != 0) goto LAB_00133fe6;
            }
            p_Var6 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                     _M_create_node<std::__cxx11::string_const&>
                               ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                                &local_c0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__args);
            std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
            local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
            bVar4 = true;
            bVar3 = false;
          }
LAB_00133fe6:
          if (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
          }
          if (bVar3) goto LAB_0013400c;
        }
        if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
        }
        if (!bVar4) {
          p_Var6 = std::__cxx11::list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>>::
                   _M_create_node<std::__cxx11::string_const&,std::shared_ptr<mocker::nasm::Inst>&>
                             ((list<mocker::nasm::Line,std::allocator<mocker::nasm::Line>> *)
                              &local_c0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __args,&local_40);
          std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
          local_c0._M_impl._M_node._M_size = local_c0._M_impl._M_node._M_size + 1;
        }
        if (local_40.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      p_Var7 = p_Var7->_M_next;
      p_Var8 = (this->funcEnd)._M_node;
    } while (p_Var7 != p_Var8);
  }
  __position_00._M_node = (this->funcBeg)._M_node;
  if (__position_00._M_node != p_Var8) {
    pSVar2 = this->section;
    do {
      p_Var7 = (__position_00._M_node)->_M_next;
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_erase
                (&pSVar2->lines,__position_00);
      __position_00._M_node = p_Var7;
    } while (p_Var7 != p_Var8);
  }
  (this->funcEnd)._M_node = p_Var8;
  (this->funcBeg)._M_node = p_Var8;
  (this->funcBeg)._M_node = p_Var8->_M_prev;
  if (local_c0._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_c0) {
    paVar1 = &LStack_98.label.field_2;
    p_Var7 = local_c0._M_impl._M_node.super__List_node_base._M_next;
    do {
      pSVar2 = this->section;
      __position._M_node = (this->funcEnd)._M_node;
      p_Var8 = p_Var7 + 2;
      if (p_Var7[1]._M_next == p_Var8) {
        LStack_98.label.field_2._M_allocated_capacity = (size_type)p_Var8->_M_next;
        LStack_98.label.field_2._8_8_ = p_Var7[2]._M_prev;
        LStack_98.label._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        LStack_98.label.field_2._M_allocated_capacity = (size_type)p_Var8->_M_next;
        LStack_98.label._M_dataplus._M_p = (pointer)p_Var7[1]._M_next;
      }
      LStack_98.label._M_string_length = (size_type)p_Var7[1]._M_prev;
      p_Var7[1]._M_next = p_Var8;
      p_Var7[1]._M_prev = (_List_node_base *)0x0;
      *(undefined1 *)&p_Var7[2]._M_next = 0;
      LStack_98.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (((_List_impl *)&p_Var7[3]._M_next)->_M_node).super__List_node_base._M_next;
      LStack_98.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[3]._M_prev;
      p_Var7[3]._M_prev = (_List_node_base *)0x0;
      (((_List_impl *)&p_Var7[3]._M_next)->_M_node).super__List_node_base._M_next =
           (_List_node_base *)0x0;
      std::__cxx11::list<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::
      emplace<mocker::nasm::Line>(&pSVar2->lines,__position,&LStack_98);
      if (LStack_98.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (LStack_98.inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)LStack_98.label._M_dataplus._M_p != paVar1) {
        operator_delete(LStack_98.label._M_dataplus._M_p,
                        (ulong)(LStack_98.label.field_2._M_allocated_capacity + 1));
      }
      p_Var7 = (((_List_impl *)&p_Var7->_M_next)->_M_node).super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)&local_c0);
  }
  (this->funcBeg)._M_node = ((this->funcBeg)._M_node)->_M_next;
  std::__cxx11::_List_base<mocker::nasm::Line,_std::allocator<mocker::nasm::Line>_>::_M_clear
            (&local_c0);
  return;
}

Assistant:

void RegisterAllocator::color(const RegMap<Node> &coloring) {
  std::list<nasm::Line> insts;
  for (auto iter = funcBeg; iter != funcEnd; ++iter) {
    auto &inst = iter->inst;
    if (!inst) {
      insts.emplace_back(*iter);
      continue;
    }
    auto newInst = nasm::replaceRegs(inst, coloring);
    if (auto p = nasm::dyc<nasm::Mov>(newInst)) {
      auto dest = nasm::dyc<nasm::Register>(p->getDest());
      auto src = nasm::dyc<nasm::Register>(p->getOperand());
      if (dest && src && dest->getIdentifier() == src->getIdentifier()) {
        insts.emplace_back(iter->label);
        continue;
      }
    }
    insts.emplace_back(iter->label, newInst);
  }

  funcBeg = funcEnd = section.erase(funcBeg, funcEnd);
  --funcBeg;
  for (auto &inst : insts) {
    section.appendLine(funcEnd, std::move(inst));
  }
  ++funcBeg;
}